

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::TypeParameterizedTestSuiteRegistry::RegisterTestSuite
          (TypeParameterizedTestSuiteRegistry *this,char *test_suite_name,
          CodeLocation *code_location)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  allocator local_91;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  int local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  TypeParameterizedTestSuiteInfo local_48;
  
  std::__cxx11::string::string((string *)&local_68,test_suite_name,&local_91);
  pcVar2 = (code_location->file)._M_dataplus._M_p;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + (code_location->file)._M_string_length);
  local_70 = code_location->line;
  paVar1 = &local_48.code_location.file.field_2;
  local_48.code_location.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_90,local_90 + local_88);
  local_48.code_location.line = local_70;
  local_48.instantiated = false;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>>>
  ::
  _M_emplace_unique<std::__cxx11::string,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>>>
              *)this,&local_68,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.code_location.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.code_location.file._M_dataplus._M_p);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void TypeParameterizedTestSuiteRegistry::RegisterTestSuite(
    const char* test_suite_name, CodeLocation code_location) {
  suites_.emplace(std::string(test_suite_name),
                 TypeParameterizedTestSuiteInfo(code_location));
}